

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::ProducerIPCClientImpl::UpdateDataSource
          (ProducerIPCClientImpl *this,DataSourceDescriptor *descriptor)

{
  Deferred<perfetto::protos::gen::UpdateDataSourceResponse> async_response;
  UpdateDataSourceRequest req;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  DeferredBase local_98;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  UpdateDataSourceRequest local_50;
  
  protos::gen::UpdateDataSourceRequest::UpdateDataSourceRequest(&local_50);
  local_50._has_field_.super__Base_bitset<1UL>._M_w._0_1_ =
       (byte)local_50._has_field_.super__Base_bitset<1UL>._M_w | 2;
  protos::gen::DataSourceDescriptor::operator=
            ((DataSourceDescriptor *)
             local_50.data_source_descriptor_.ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::DataSourceDescriptor,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_std::default_delete<perfetto::protos::gen::DataSourceDescriptor>_>
             .super__Head_base<0UL,_perfetto::protos::gen::DataSourceDescriptor_*,_false>.
             _M_head_impl,descriptor);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = (code *)0x0;
  uStack_a0 = 0;
  ipc::Deferred<perfetto::protos::gen::UpdateDataSourceResponse>::Deferred
            ((Deferred<perfetto::protos::gen::UpdateDataSourceResponse> *)&local_98,
             (function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>)>
              *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)((_Any_data *)&local_b8,(_Any_data *)&local_b8,__destroy_functor);
  }
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:73027:7)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:73027:7)>
             ::_M_manager;
  ipc::Deferred<perfetto::protos::gen::UpdateDataSourceResponse>::Bind
            ((Deferred<perfetto::protos::gen::UpdateDataSourceResponse> *)&local_98,
             (function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::UpdateDataSourceResponse>)>
              *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)((_Any_data *)&local_d8,(_Any_data *)&local_d8,__destroy_functor);
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  ipc::DeferredBase::Move((DeferredBase *)&local_78,&local_98);
  protos::gen::ProducerPortProxy::UpdateDataSource
            (&this->producer_port_,&local_50,(DeferredUpdateDataSourceResponse *)&local_78,-1);
  ipc::DeferredBase::~DeferredBase((DeferredBase *)&local_78);
  ipc::DeferredBase::~DeferredBase(&local_98);
  protos::gen::UpdateDataSourceRequest::~UpdateDataSourceRequest(&local_50);
  return;
}

Assistant:

void ProducerIPCClientImpl::UpdateDataSource(
    const DataSourceDescriptor& descriptor) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  if (!connected_) {
    PERFETTO_DLOG(
        "Cannot UpdateDataSource(), not connected to tracing service");
  }
  protos::gen::UpdateDataSourceRequest req;
  *req.mutable_data_source_descriptor() = descriptor;
  ipc::Deferred<protos::gen::UpdateDataSourceResponse> async_response;
  async_response.Bind(
      [](ipc::AsyncResult<protos::gen::UpdateDataSourceResponse> response) {
        if (!response)
          PERFETTO_DLOG("UpdateDataSource() failed: connection reset");
      });
  producer_port_.UpdateDataSource(req, std::move(async_response));
}